

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

Texture2D *
glu::Texture2D::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          char **levelFileNames)

{
  EVP_PKEY_CTX *dst;
  pointer pPVar1;
  bool bVar2;
  Texture2D *this;
  ulong uVar3;
  TestError *this_00;
  InternalError *this_01;
  long lVar4;
  long lVar5;
  TextureLevel level;
  string ext;
  PixelBufferAccess local_58;
  
  de::FilePath::FilePath((FilePath *)&level,*levelFileNames);
  de::FilePath::getFileExtension_abi_cxx11_(&ext,(FilePath *)&level);
  std::__cxx11::string::~string((string *)&level);
  bVar2 = std::operator==(&ext,"png");
  if (bVar2) {
    tcu::TextureLevel::TextureLevel(&level);
    tcu::ImageIO::loadPNG(&level,archive,*levelFileNames);
    bVar2 = ((ulong)level.m_format & 0xffffffff00000000) == 0x300000000;
    if ((!bVar2) || (1 < level.m_format.order - RGB)) {
      this_01 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_01,(char *)0x0,
                 "level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) || level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8)"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0xe6);
      __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    this = (Texture2D *)operator_new(0x70);
    Texture2D(this,context,(level.m_format.order == RGBA && bVar2) + 0x1907,0x1401,
              level.m_size.m_data[0],level.m_size.m_data[1]);
    tcu::Texture2D::allocLevel(&this->m_refTexture,0);
    dst = (EVP_PKEY_CTX *)
          (this->m_refTexture).super_TextureLevelPyramid.m_access.
          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
          _M_impl.super__Vector_impl_data._M_start;
    tcu::TextureLevel::getAccess(&local_58,&level);
    tcu::copy(dst,(EVP_PKEY_CTX *)&local_58);
    lVar4 = 0x28;
    for (lVar5 = 1; lVar5 < numLevels; lVar5 = lVar5 + 1) {
      tcu::ImageIO::loadPNG(&level,archive,levelFileNames[lVar5]);
      tcu::Texture2D::allocLevel(&this->m_refTexture,(int)lVar5);
      pPVar1 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::TextureLevel::getAccess(&local_58,&level);
      tcu::copy((EVP_PKEY_CTX *)
                ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar4 + -8),
                (EVP_PKEY_CTX *)&local_58);
      lVar4 = lVar4 + 0x28;
    }
    (*this->_vptr_Texture2D[2])(this);
    tcu::TextureLevel::~TextureLevel(&level);
  }
  else {
    bVar2 = std::operator==(&ext,"pkm");
    if (!bVar2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported file format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x110);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)&level,
               (long)numLevels,(allocator_type *)&local_58);
    lVar5 = 0;
    uVar3 = 0;
    if (0 < numLevels) {
      uVar3 = (ulong)(uint)numLevels;
    }
    for (; uVar3 * 0x28 - lVar5 != 0; lVar5 = lVar5 + 0x28) {
      tcu::ImageIO::loadPKM
                ((CompressedTexture *)((long)level.m_format + lVar5),archive,*levelFileNames);
      levelFileNames = levelFileNames + 1;
    }
    this = (Texture2D *)operator_new(0x70);
    local_58.super_ConstPixelBufferAccess.m_format.order = I;
    Texture2D(this,context,contextInfo,numLevels,(CompressedTexture *)level.m_format,
              (TexDecompressionParams *)&local_58);
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)&level);
  }
  std::__cxx11::string::~string((string *)&ext);
  return this;
}

Assistant:

Texture2D* Texture2D::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const char* const* levelFileNames)
{
	DE_ASSERT(numLevels > 0);

	std::string ext = de::FilePath(levelFileNames[0]).getFileExtension();

	if (ext == "png")
	{
		// Uncompressed texture.

		tcu::TextureLevel level;

		// Load level 0.
		tcu::ImageIO::loadPNG(level, archive, levelFileNames[0]);

		TCU_CHECK_INTERNAL(level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) ||
						   level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8));

		bool		isRGBA		= level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
		Texture2D*	texture		= new Texture2D(context, isRGBA ? GL_RGBA : GL_RGB, GL_UNSIGNED_BYTE, level.getWidth(), level.getHeight());

		try
		{
			// Fill level 0.
			texture->getRefTexture().allocLevel(0);
			tcu::copy(texture->getRefTexture().getLevel(0), level.getAccess());

			// Fill remaining levels.
			for (int levelNdx = 1; levelNdx < numLevels; levelNdx++)
			{
				tcu::ImageIO::loadPNG(level, archive, levelFileNames[levelNdx]);

				texture->getRefTexture().allocLevel(levelNdx);
				tcu::copy(texture->getRefTexture().getLevel(levelNdx), level.getAccess());
			}

			// Upload data.
			texture->upload();
		}
		catch (const std::exception&)
		{
			delete texture;
			throw;
		}

		return texture;
	}
	else if (ext == "pkm")
	{
		// Compressed texture.
		vector<tcu::CompressedTexture> levels(numLevels);

		for (int ndx = 0; ndx < numLevels; ndx++)
			tcu::ImageIO::loadPKM(levels[ndx], archive, levelFileNames[ndx]);

		return new Texture2D(context, contextInfo, numLevels, &levels[0]);
	}
	else
		TCU_FAIL("Unsupported file format");
}